

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

bool cmDependsFortran::ModulesDiffer(string *modFile,string *stampFile,string *compilerId)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  uchar hdr [2];
  char seq [1];
  ifstream finModFile;
  byte abStack_410 [488];
  ifstream finStampFile;
  uint auStack_208 [122];
  
  bVar2 = std::operator==(compilerId,"SunPro");
  if (bVar2) {
    bVar2 = cmsys::SystemTools::FilesDiffer(modFile,stampFile);
    return bVar2;
  }
  std::ifstream::ifstream(&finModFile,(modFile->_M_dataplus)._M_p,_S_in);
  std::ifstream::ifstream(&finStampFile,(stampFile->_M_dataplus)._M_p,_S_in);
  bVar2 = true;
  if (((abStack_410[(long)_finModFile[-3]] & 5) != 0) ||
     ((*(byte *)((long)auStack_208 + (long)_finStampFile[-3]) & 5) != 0)) goto LAB_004d0bdb;
  bVar3 = std::operator==(compilerId,"GNU");
  if (bVar3) {
    plVar6 = (long *)std::istream::read((char *)&finModFile,(long)hdr);
    uVar1 = *(uint *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20);
    std::istream::seekg(&finModFile,0,0);
    if ((((uVar1 & 5) != 0) || (hdr[0] != '\x1f')) || (hdr[1] != 0x8b)) {
      seq[0] = '\n';
      bVar3 = cmFortranStreamContainsSequence((istream *)&finModFile,seq,1);
      if (!bVar3) {
        poVar7 = std::operator<<((ostream *)&std::cerr,(string *)compilerId);
        poVar7 = std::operator<<(poVar7," fortran module ");
        poVar7 = std::operator<<(poVar7,(string *)modFile);
        poVar7 = std::operator<<(poVar7," has unexpected format.");
        std::endl<char,std::char_traits<char>>(poVar7);
        goto LAB_004d0bdb;
      }
      bVar3 = cmFortranStreamContainsSequence((istream *)&finStampFile,seq,1);
LAB_004d0cff:
      if (bVar3 == false) goto LAB_004d0bdb;
    }
  }
  else {
    bVar3 = std::operator==(compilerId,"Intel");
    if ((bVar3) || (bVar3 = std::operator==(compilerId,"IntelLLVM"), bVar3)) {
      hdr[0] = '\n';
      hdr[1] = '\0';
      std::istream::get();
      std::istream::get();
      bVar3 = cmFortranStreamContainsSequence((istream *)&finModFile,(char *)hdr,2);
      if (!bVar3) {
        poVar7 = std::operator<<((ostream *)&std::cerr,(string *)compilerId);
        poVar7 = std::operator<<(poVar7," fortran module ");
        poVar7 = std::operator<<(poVar7,(string *)modFile);
        poVar7 = std::operator<<(poVar7," has unexpected format.");
        std::endl<char,std::char_traits<char>>(poVar7);
        goto LAB_004d0bdb;
      }
      bVar3 = cmFortranStreamContainsSequence((istream *)&finStampFile,(char *)hdr,2);
      goto LAB_004d0cff;
    }
  }
  while( true ) {
    iVar4 = std::istream::get();
    iVar5 = std::istream::get();
    if ((abStack_410[(long)_finModFile[-3]] & 5) != 0) break;
    if ((iVar4 != iVar5) || ((*(uint *)((long)auStack_208 + (long)_finStampFile[-3]) & 5) != 0))
    goto LAB_004d0bdb;
  }
  bVar2 = (*(byte *)((long)auStack_208 + (long)_finStampFile[-3]) & 5) == 0;
LAB_004d0bdb:
  std::ifstream::~ifstream(&finStampFile);
  std::ifstream::~ifstream(&finModFile);
  return bVar2;
}

Assistant:

bool cmDependsFortran::ModulesDiffer(const std::string& modFile,
                                     const std::string& stampFile,
                                     const std::string& compilerId)
{
  /*
  gnu >= 4.9:
    A mod file is an ascii file compressed with gzip.
    Compiling twice produces identical modules.

  gnu < 4.9:
    A mod file is an ascii file.
    <bar.mod>
    FORTRAN module created from /path/to/foo.f90 on Sun Dec 30 22:47:58 2007
    If you edit this, you'll get what you deserve.
    ...
    </bar.mod>
    As you can see the first line contains the date.

  intel:
    A mod file is a binary file.
    However, looking into both generated bar.mod files with a hex editor
    shows that they differ only before a sequence linefeed-zero (0x0A 0x00)
    which is located some bytes in front of the absolute path to the source
    file.

  sun:
    A mod file is a binary file.  Compiling twice produces identical modules.

  others:
    TODO ...
  */

  /* Compilers which do _not_ produce different mod content when the same
   * source is compiled twice
   *   -SunPro
   */
  if (compilerId == "SunPro") {
    return cmSystemTools::FilesDiffer(modFile, stampFile);
  }

#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream finModFile(modFile.c_str(), std::ios::in | std::ios::binary);
  cmsys::ifstream finStampFile(stampFile.c_str(),
                               std::ios::in | std::ios::binary);
#else
  cmsys::ifstream finModFile(modFile.c_str());
  cmsys::ifstream finStampFile(stampFile.c_str());
#endif
  if (!finModFile || !finStampFile) {
    // At least one of the files does not exist.  The modules differ.
    return true;
  }

  /* Compilers which _do_ produce different mod content when the same
   * source is compiled twice
   *   -GNU
   *   -Intel
   *
   * Eat the stream content until all recompile only related changes
   * are left behind.
   */
  if (compilerId == "GNU") {
    // GNU Fortran 4.9 and later compress .mod files with gzip
    // but also do not include a date so we can fall through to
    // compare them without skipping any prefix.
    unsigned char hdr[2];
    bool okay = !finModFile.read(reinterpret_cast<char*>(hdr), 2).fail();
    finModFile.seekg(0);
    if (!okay || hdr[0] != 0x1f || hdr[1] != 0x8b) {
      const char seq[1] = { '\n' };
      const int seqlen = 1;

      if (!cmFortranStreamContainsSequence(finModFile, seq, seqlen)) {
        // The module is of unexpected format.  Assume it is different.
        std::cerr << compilerId << " fortran module " << modFile
                  << " has unexpected format." << std::endl;
        return true;
      }

      if (!cmFortranStreamContainsSequence(finStampFile, seq, seqlen)) {
        // The stamp must differ if the sequence is not contained.
        return true;
      }
    }
  } else if (compilerId == "Intel" || compilerId == "IntelLLVM") {
    const char seq[2] = { '\n', '\0' };
    const int seqlen = 2;

    // Skip the leading byte which appears to be a version number.
    // We do not need to check for an error because the sequence search
    // below will fail in that case.
    finModFile.get();
    finStampFile.get();

    if (!cmFortranStreamContainsSequence(finModFile, seq, seqlen)) {
      // The module is of unexpected format.  Assume it is different.
      std::cerr << compilerId << " fortran module " << modFile
                << " has unexpected format." << std::endl;
      return true;
    }

    if (!cmFortranStreamContainsSequence(finStampFile, seq, seqlen)) {
      // The stamp must differ if the sequence is not contained.
      return true;
    }
  }

  // Compare the remaining content.  If no compiler id matched above,
  // including the case none was given, this will compare the whole
  // content.
  return cmFortranStreamsDiffer(finModFile, finStampFile);
}